

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

string * preprocessMacro_abi_cxx11_
                   (string *__return_storage_ptr__,char *text,MipsImmediateData *immediates)

{
  char **in_R8;
  char *text_local;
  Identifier labelName;
  
  text_local = text;
  SymbolTable::getUniqueLabelName(&labelName,&Global.symbolTable,true);
  Expression::replaceMemoryPos(&(immediates->primary).expression,&labelName);
  Expression::replaceMemoryPos(&(immediates->secondary).expression,&labelName);
  tinyformat::format<Identifier,char_const*>
            (__return_storage_ptr__,(tinyformat *)"%s: %s",(char *)&labelName,
             (Identifier *)&text_local,in_R8);
  std::__cxx11::string::~string((string *)&labelName);
  return __return_storage_ptr__;
}

Assistant:

std::string preprocessMacro(const char* text, MipsImmediateData& immediates)
{
	// A macro is turned into a sequence of opcodes that are parsed seperately.
	// Any expressions used in the macro may be evaluated at a different memory
	// position, so the '.' operator needs to be replaced by a label at the start
	// of the macro
	Identifier labelName = Global.symbolTable.getUniqueLabelName(true);
	immediates.primary.expression.replaceMemoryPos(labelName);
	immediates.secondary.expression.replaceMemoryPos(labelName);

	return tfm::format("%s: %s",labelName,text);
}